

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerset.h
# Opt level: O3

void __thiscall
wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>::FinitePowersetLattice
          (FinitePowersetLattice<wasm::LocalSet_*> *this,
          vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *setMembers)

{
  pointer ppLVar1;
  mapped_type *pmVar2;
  pointer ppLVar3;
  mapped_type mVar4;
  long lVar5;
  
  ppLVar3 = (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar1 = (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  (this->intLattice).setSize = (long)ppLVar1 - (long)ppLVar3 >> 3;
  (this->members).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppLVar3;
  (this->members).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppLVar1;
  (this->members).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>)._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memberIndices)._M_h._M_buckets = &(this->memberIndices)._M_h._M_single_bucket;
  (this->memberIndices)._M_h._M_bucket_count = 1;
  (this->memberIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memberIndices)._M_h._M_element_count = 0;
  (this->memberIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->memberIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->memberIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ppLVar3 = (this->members).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->members).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppLVar3) {
    lVar5 = 0;
    mVar4 = 0;
    do {
      pmVar2 = std::__detail::
               _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_long>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_long>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->memberIndices,(key_type *)((long)ppLVar3 + lVar5));
      *pmVar2 = mVar4;
      mVar4 = mVar4 + 1;
      ppLVar3 = (this->members).
                super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 8;
    } while (mVar4 < (ulong)((long)(this->members).
                                   super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar3 >> 3))
    ;
  }
  return;
}

Assistant:

FinitePowersetLattice(std::vector<T>&& setMembers)
    : intLattice(setMembers.size()), members(std::move(setMembers)) {
    for (size_t i = 0; i < members.size(); ++i) {
      memberIndices[members[i]] = i;
    }
  }